

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parseInvalidIntegerLiteralTest_Test::TestBody
          (OpenDDLParserTest_parseInvalidIntegerLiteralTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  char *out;
  char *in;
  char *end1;
  Value *pVStack_20;
  char token1 [2];
  Value *data;
  size_t len1;
  OpenDDLParserTest_parseInvalidIntegerLiteralTest_Test *this_local;
  
  data = (Value *)0x0;
  pVStack_20 = (Value *)0x0;
  end1._6_2_ = 0x31;
  pcVar2 = (char *)((long)&end1 + 6);
  len1 = (size_t)this;
  in = findEnd(pcVar2,(size_t *)&data);
  out = pcVar2;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLParser::parseIntegerLiteral(pcVar2,in,&stack0xffffffffffffffe0,ddl_float);
  testing::internal::EqHelper<false>::Compare<char*,char*>
            ((EqHelper<false> *)local_50,"out","in",(char **)&gtest_ar.message_,&out);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  testing::internal::EqHelper<true>::Compare<ODDLParser::Value>
            ((EqHelper<true> *)local_80,"nullptr","data",(Secret *)0x0,pVStack_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x1de,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseInvalidIntegerLiteralTest) {
    size_t len1(0);
    Value *data(nullptr);
    char token1[] = "1", *end1(findEnd(token1, len1));
    char *in(token1);
    char *out = OpenDDLParser::parseIntegerLiteral(token1, end1, &data, Value::ValueType::ddl_float);
    EXPECT_EQ(out, in);
    ASSERT_EQ(nullptr, data);
}